

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O3

void CombinationKeygenRecurse<Blob<160>,block128>
               (block128 *key,int len,int maxlen,block128 *blocks,int blockcount,pfHash hash,
               vector<Blob<160>,_std::allocator<Blob<160>_>_> *hashes)

{
  char *pcVar1;
  char *pcVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  block128 *pbVar18;
  long lVar19;
  Blob<160> h;
  value_type local_48;
  
  if (0 < blockcount && len != maxlen) {
    lVar19 = 0;
    pbVar18 = key + len;
    do {
      pcVar1 = blocks->c + lVar19;
      uVar3 = *(undefined8 *)(pcVar1 + 8);
      uVar4 = *(undefined8 *)(pcVar1 + 0x10);
      uVar5 = *(undefined8 *)(pcVar1 + 0x18);
      uVar6 = *(undefined8 *)(pcVar1 + 0x20);
      uVar7 = *(undefined8 *)(pcVar1 + 0x28);
      uVar8 = *(undefined8 *)(pcVar1 + 0x30);
      uVar9 = *(undefined8 *)(pcVar1 + 0x38);
      pcVar2 = blocks->c + lVar19 + 0x40;
      uVar10 = *(undefined8 *)pcVar2;
      uVar11 = *(undefined8 *)(pcVar2 + 8);
      uVar12 = *(undefined8 *)(pcVar2 + 0x10);
      uVar13 = *(undefined8 *)(pcVar2 + 0x18);
      uVar14 = *(undefined8 *)(pcVar2 + 0x20);
      uVar15 = *(undefined8 *)(pcVar2 + 0x28);
      uVar16 = *(undefined8 *)(pcVar2 + 0x30);
      uVar17 = *(undefined8 *)(pcVar2 + 0x38);
      *(undefined8 *)pbVar18->c = *(undefined8 *)pcVar1;
      *(undefined8 *)(pbVar18->c + 8) = uVar3;
      *(undefined8 *)(pbVar18->c + 0x10) = uVar4;
      *(undefined8 *)(pbVar18->c + 0x18) = uVar5;
      *(undefined8 *)(pbVar18->c + 0x20) = uVar6;
      *(undefined8 *)(pbVar18->c + 0x28) = uVar7;
      *(undefined8 *)(pbVar18->c + 0x30) = uVar8;
      *(undefined8 *)(pbVar18->c + 0x38) = uVar9;
      *(undefined8 *)(pbVar18->c + 0x40) = uVar10;
      *(undefined8 *)(pbVar18->c + 0x48) = uVar11;
      *(undefined8 *)(pbVar18->c + 0x50) = uVar12;
      *(undefined8 *)(pbVar18->c + 0x58) = uVar13;
      *(undefined8 *)(pbVar18->c + 0x60) = uVar14;
      *(undefined8 *)(pbVar18->c + 0x68) = uVar15;
      *(undefined8 *)(pbVar18->c + 0x70) = uVar16;
      *(undefined8 *)(pbVar18->c + 0x78) = uVar17;
      local_48.bytes[0x10] = '\0';
      local_48.bytes[0x11] = '\0';
      local_48.bytes[0x12] = '\0';
      local_48.bytes[0x13] = '\0';
      local_48.bytes[0] = '\0';
      local_48.bytes[1] = '\0';
      local_48.bytes[2] = '\0';
      local_48.bytes[3] = '\0';
      local_48.bytes[4] = '\0';
      local_48.bytes[5] = '\0';
      local_48.bytes[6] = '\0';
      local_48.bytes[7] = '\0';
      local_48.bytes[8] = '\0';
      local_48.bytes[9] = '\0';
      local_48.bytes[10] = '\0';
      local_48.bytes[0xb] = '\0';
      local_48.bytes[0xc] = '\0';
      local_48.bytes[0xd] = '\0';
      local_48.bytes[0xe] = '\0';
      local_48.bytes[0xf] = '\0';
      (*hash)(key,(len + 1) * 0x80,0,&local_48);
      std::vector<Blob<160>,_std::allocator<Blob<160>_>_>::push_back(hashes,&local_48);
      CombinationKeygenRecurse<Blob<160>,block128>(key,len + 1,maxlen,blocks,blockcount,hash,hashes)
      ;
      lVar19 = lVar19 + 0x80;
    } while ((ulong)(uint)blockcount << 7 != lVar19);
  }
  return;
}

Assistant:

void CombinationKeygenRecurse ( blocktype * key, int len, int maxlen,
                  blocktype * blocks, int blockcount,
                  pfHash hash, std::vector<hashtype> & hashes )
{
  if(len == maxlen) return;  // end recursion

  for(int i = 0; i < blockcount; i++)
  {
    key[len] = blocks[i];

    //if(len == maxlen-1)
    {
      hashtype h;
      hash(key, (len+1) * sizeof(blocktype), 0, &h);
      hashes.push_back(h);
    }

    //else
    {
      CombinationKeygenRecurse(key,len+1,maxlen,blocks,blockcount,hash,hashes);
    }
  }
}